

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

void kokkosp_pop_profile_region(void)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = KokkosTools::SpaceTimeStack::global_state;
  lVar3 = std::chrono::_V2::system_clock::now();
  puVar1 = *(undefined8 **)(lVar2 + 0x98);
  puVar1[0xc] = (double)(lVar3 - puVar1[0x12]) * 1e-09 + (double)puVar1[0xc];
  *(undefined8 *)(lVar2 + 0x98) = *puVar1;
  return;
}

Assistant:

void kokkosp_pop_profile_region() { global_state->pop_region(); }